

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O2

void __thiscall sim_if__Test::TestBody(sim_if__Test *this)

{
  __node_base_ptr *this_00;
  Generator *this_01;
  Var *pVVar1;
  Var *var;
  Port *this_02;
  Const *var_00;
  Expr *pEVar2;
  char *pcVar3;
  optional<unsigned_long> oVar4;
  optional<unsigned_long> value;
  undefined1 local_358 [8];
  Context context;
  Simulator sim;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  Var *local_80;
  Port *local_78;
  undefined1 local_70 [8];
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  AssertionResult gtest_ar;
  Message local_38;
  
  kratos::Context::Context((Context *)local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"mod",
             (allocator<char> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_01 = kratos::Context::generator
                      ((Context *)local_358,
                       (string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"a",
             (allocator<char> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVVar1 = kratos::Generator::var
                     (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,1);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"b",
             (allocator<char> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  var = kratos::Generator::var
                  (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,1);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"in",
             (allocator<char> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_02 = kratos::Generator::port
                      (this_01,In,(string *)&context.tracked_generators_._M_h._M_single_bucket,1);
  std::__cxx11::string::~string((string *)&context.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::combinational
            ((Generator *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  var_00 = kratos::Const::constant(1,1,false);
  pEVar2 = kratos::Var::eq(&this_02->super_Var,&var_00->super_Var);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &context.tracked_generators_._M_h._M_single_bucket,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pEVar2->super_Var).super_enable_shared_from_this<kratos::Var>);
  local_78 = this_02;
  std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>>((shared_ptr<kratos::Var> *)local_70)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sim);
  local_80 = pVVar1;
  kratos::Var::assign((Var *)&sim.simulation_depth_,pVVar1);
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)sim.simulation_depth_;
  sim.values_._M_h._M_buckets = (__buckets_ptr)_Stack_88._M_pi;
  sim.simulation_depth_ = 0;
  _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)local_70,
             (shared_ptr<kratos::Stmt> *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sim);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88);
  this_00 = &context.tracked_generators_._M_h._M_single_bucket;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sim);
  kratos::Simulator::Simulator
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,this_01);
  pVVar1 = local_80;
  oVar4 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,local_80);
  sim.simulation_depth_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  _Stack_88._M_pi._0_1_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,std::nullopt_t>
            ((internal *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"v","std::nullopt",(optional<unsigned_long> *)&sim.simulation_depth_,
             (nullopt_t *)&std::nullopt);
  if ((char)comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == '\0') {
    testing::Message::Message(&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xbe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 1;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,&local_78->super_Var,
             oVar4,true);
  value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 1;
  value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var,value,true);
  oVar4 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,pVVar1);
  sim.simulation_depth_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  _Stack_88._M_pi._0_1_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_38.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"*v","1",&sim.simulation_depth_,(int *)&local_38);
  if ((char)comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == '\0') {
    testing::Message::Message(&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xc2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if ((long *)CONCAT44(local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_38.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_38.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Simulator::~Simulator((Simulator *)&context.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&comb);
  kratos::Context::~Context((Context *)local_358);
  return;
}

Assistant:

TEST(sim, if_) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto &in = mod.port(PortDirection::In, "in", 1);
    auto comb = mod.combinational();
    auto if_ = std::make_shared<IfStmt>((in.eq(constant(1, 1))).shared_from_this());
    if_->add_then_stmt(a.assign(b));
    comb->add_stmt(if_);

    Simulator sim(&mod);
    auto v = sim.get(&a);
    EXPECT_EQ(v, std::nullopt);
    sim.set(&in, 1);
    sim.set(&b, 1);
    v = sim.get(&a);
    EXPECT_EQ(*v, 1);
}